

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O3

WebPInfoStatus ParseLossyHeader(ChunkData *chunk_data,WebPInfo *webp_info)

{
  byte bVar1;
  byte bVar2;
  WebPInfoStatus WVar3;
  uint64_t uVar4;
  undefined1 *puVar5;
  WebPInfo *in_RDX;
  long lVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  uint uVar10;
  uint3 *puVar11;
  long lVar12;
  ulong uVar13;
  byte *data;
  undefined1 *data_size;
  bool bVar14;
  int dq_uv_ac;
  int dq_uv_dc;
  int dq_y2_ac;
  int dq_y2_dc;
  int dq_y1_dc;
  uint64_t local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  undefined1 *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar2 = (byte)webp_info->canvas_width_;
  iVar8 = webp_info->canvas_width_;
  uVar10 = bVar2 >> 1 & 7;
  puts("  Parsing lossy bitstream...");
  if (3 < uVar10) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    ParseLossyHeader_cold_10();
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if ((bVar2 & 0x10) == 0) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    ParseLossyHeader_cold_9();
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  uVar7 = (uint)(uint3)((uint3)iVar8 >> 5);
  pcVar9 = "No";
  if ((bVar2 & 1) == 0) {
    pcVar9 = "Yes";
  }
  printf("  Key frame:        %s\n  Profile:          %d\n  Display:          %s\n  Part. 0 length:   %d\n"
         ,pcVar9,(ulong)uVar10,"Yes",(ulong)uVar7);
  if ((bVar2 & 1) != 0) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    ParseLossyHeader_cold_1();
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (((*(char *)((long)&webp_info->canvas_width_ + 3) != -99) ||
      ((char)webp_info->canvas_height_ != '\x01')) ||
     (*(char *)((long)&webp_info->canvas_height_ + 1) != '*')) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    ParseLossyHeader_cold_2();
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  bVar2 = *(byte *)((long)&webp_info->canvas_height_ + 3);
  bVar1 = *(byte *)((long)&webp_info->loop_count_ + 1);
  printf("  Width:            %d\n  X scale:          %d\n  Height:           %d\n  Y scale:          %d\n"
         ,(ulong)((bVar2 & 0x3f) << 8 | (uint)*(byte *)((long)&webp_info->canvas_height_ + 2)),
         (ulong)(bVar2 >> 6),(ulong)((bVar1 & 0x3f) << 8 | (uint)(byte)webp_info->loop_count_),
         (ulong)(bVar1 >> 6));
  data_size = (undefined1 *)((long)&chunk_data[-1].size_ + 6);
  local_48 = (undefined1 *)(ulong)uVar7;
  lVar12 = (long)data_size - (long)local_48;
  if (data_size < local_48 || lVar12 == 0) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    ParseLossyHeader_cold_3();
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data = (byte *)((long)&webp_info->loop_count_ + 2);
  bVar2 = *data;
  local_68 = 2;
  printf("  Color space:      %d\n",(ulong)(bVar2 >> 7));
  printf("  Clamp type:       %d\n",(ulong)(bVar2 >> 6 & 1));
  WVar3 = ParseLossySegmentHeader(in_RDX,data,(size_t)data_size,&local_68);
  if (WVar3 != WEBP_INFO_OK) {
    return WVar3;
  }
  WVar3 = ParseLossyFilterHeader(in_RDX,data,(size_t)data_size,&local_68);
  if (WVar3 != WEBP_INFO_OK) {
    return WVar3;
  }
  puVar11 = (uint3 *)(data + (long)local_48);
  local_40 = local_68 + 2;
  bVar2 = 0;
  lVar6 = -2;
  uVar4 = local_68;
  do {
    if (data_size <= (undefined1 *)(uVar4 >> 3)) {
      if (in_RDX->show_diagnosis_ == 0) {
        return WEBP_INFO_TRUNCATED_DATA;
      }
      ParseLossyHeader_cold_4();
      return WEBP_INFO_TRUNCATED_DATA;
    }
    bVar2 = bVar2 * '\x02' - ((char)(data[(long)(uVar4 >> 3)] << ((byte)uVar4 & 7)) >> 7);
    lVar6 = lVar6 + 1;
    uVar4 = uVar4 + 1;
  } while (lVar6 != 0);
  local_60 = 1 << (bVar2 & 0x1f);
  iVar8 = (3 << (bVar2 & 0x1f)) + -3;
  if ((int)lVar12 < iVar8) {
    if (in_RDX->show_diagnosis_ == 0) {
      return WEBP_INFO_TRUNCATED_DATA;
    }
    ParseLossyHeader_cold_8();
    return WEBP_INFO_TRUNCATED_DATA;
  }
  local_38 = local_68;
  printf("  Total partitions: %d\n",(ulong)local_60);
  if (1 < (int)local_60) {
    uVar13 = lVar12 - iVar8;
    uVar10 = 1;
    do {
      bVar14 = uVar13 < *puVar11;
      uVar13 = uVar13 - *puVar11;
      if (bVar14) {
        if (in_RDX->show_diagnosis_ == 0) {
          return WEBP_INFO_TRUNCATED_DATA;
        }
        ParseLossyHeader_cold_7();
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  Part. %d length:   %d\n",(ulong)uVar10);
      puVar11 = (uint3 *)((long)puVar11 + 3);
      uVar10 = uVar10 + 1;
    } while (local_60 != uVar10);
  }
  uVar10 = 0;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  lVar12 = -7;
  uVar13 = local_40;
  do {
    if (data_size <= (undefined1 *)(uVar13 >> 3)) goto LAB_00104693;
    uVar10 = (uint)((byte)(data[(long)(uVar13 >> 3)] << ((byte)uVar13 & 7)) >> 7) + uVar10 * 2;
    lVar12 = lVar12 + 1;
    uVar13 = uVar13 + 1;
  } while (lVar12 != 0);
  puVar5 = (undefined1 *)(local_38 + 9 >> 3);
  if ((((puVar5 < data_size) &&
       ((local_68 = local_38 + 10, -1 < (char)(data[(long)puVar5] << ((byte)(local_38 + 9) & 7)) ||
        (iVar8 = GetSignedBits(data,(size_t)data_size,4,(int *)&local_4c,&local_68), iVar8 != 0))))
      && (puVar5 = (undefined1 *)(local_68 >> 3), puVar5 < data_size)) &&
     ((((uVar13 = local_68 + 1, bVar2 = (byte)local_68, local_68 = uVar13,
        -1 < (char)(data[(long)puVar5] << (bVar2 & 7)) ||
        (iVar8 = GetSignedBits(data,(size_t)data_size,4,(int *)&local_50,&local_68), iVar8 != 0)) &&
       ((puVar5 = (undefined1 *)(local_68 >> 3), puVar5 < data_size &&
        ((((uVar13 = local_68 + 1, bVar2 = (byte)local_68, local_68 = uVar13,
           -1 < (char)(data[(long)puVar5] << (bVar2 & 7)) ||
           (iVar8 = GetSignedBits(data,(size_t)data_size,4,(int *)&local_54,&local_68), iVar8 != 0))
          && (puVar5 = (undefined1 *)(local_68 >> 3), puVar5 < data_size)) &&
         ((uVar13 = local_68 + 1, bVar2 = (byte)local_68, local_68 = uVar13,
          -1 < (char)(data[(long)puVar5] << (bVar2 & 7)) ||
          (iVar8 = GetSignedBits(data,(size_t)data_size,4,(int *)&local_58,&local_68), iVar8 != 0)))
         ))))) && (puVar5 = (undefined1 *)(local_68 >> 3), puVar5 < data_size)))) {
    uVar13 = local_68 + 1;
    bVar2 = (byte)local_68;
    WVar3 = WEBP_INFO_OK;
    local_60 = 0;
    local_68 = uVar13;
    if ((char)(data[(long)puVar5] << (bVar2 & 7)) < '\0') {
      iVar8 = GetSignedBits(data,(size_t)data_size,4,(int *)&local_5c,&local_68);
      if (iVar8 == 0) goto LAB_00104693;
      local_60 = local_5c;
    }
    uVar4 = local_68;
    printf("  Base Q:           %d\n",(ulong)uVar10);
    printf("  DQ Y1 DC:         %d\n",(ulong)local_4c);
    printf("  DQ Y2 DC:         %d\n",(ulong)local_50);
    printf("  DQ Y2 AC:         %d\n",(ulong)local_54);
    printf("  DQ UV DC:         %d\n",(ulong)local_58);
    printf("  DQ UV AC:         %d\n",(ulong)local_60);
    if ((local_48 <= (undefined1 *)(uVar4 >> 3)) &&
       (WVar3 = WEBP_INFO_TRUNCATED_DATA, in_RDX->show_diagnosis_ != 0)) {
      ParseLossyHeader_cold_6();
    }
  }
  else {
LAB_00104693:
    if (in_RDX->show_diagnosis_ != 0) {
      ParseLossyHeader_cold_5();
    }
    WVar3 = WEBP_INFO_TRUNCATED_DATA;
  }
  return WVar3;
}

Assistant:

static WebPInfoStatus ParseLossyHeader(const ChunkData* const chunk_data,
                                       const WebPInfo* const webp_info) {
  const uint8_t* data = chunk_data->payload_;
  size_t data_size = chunk_data->size_ - CHUNK_HEADER_SIZE;
  const uint32_t bits = (uint32_t)data[0] | (data[1] << 8) | (data[2] << 16);
  const int key_frame = !(bits & 1);
  const int profile = (bits >> 1) & 7;
  const int display = (bits >> 4) & 1;
  const uint32_t partition0_length = (bits >> 5);
  WebPInfoStatus status = WEBP_INFO_OK;
  uint64_t bit_position = 0;
  uint64_t* const bit_pos = &bit_position;
  int colorspace, clamp_type;
  printf("  Parsing lossy bitstream...\n");
  // Calling WebPGetFeatures() in ProcessImageChunk() should ensure this.
  assert(chunk_data->size_ >= CHUNK_HEADER_SIZE + 10);
  if (profile > 3) {
    LOG_ERROR("Unknown profile.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (!display) {
    LOG_ERROR("Frame is not displayable.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  data += 3;
  data_size -= 3;
  printf("  Key frame:        %s\n"
         "  Profile:          %d\n"
         "  Display:          %s\n"
         "  Part. 0 length:   %d\n",
         key_frame ? "Yes" : "No", profile,
         display ? "Yes" : "No", partition0_length);
  if (key_frame) {
    if (!(data[0] == 0x9d && data[1] == 0x01 && data[2] == 0x2a)) {
      LOG_ERROR("Invalid lossy bitstream signature.");
      return WEBP_INFO_BITSTREAM_ERROR;
    }
    printf("  Width:            %d\n"
           "  X scale:          %d\n"
           "  Height:           %d\n"
           "  Y scale:          %d\n",
           ((data[4] << 8) | data[3]) & 0x3fff, data[4] >> 6,
           ((data[6] << 8) | data[5]) & 0x3fff, data[6] >> 6);
    data += 7;
    data_size -= 7;
  } else {
    LOG_ERROR("Non-keyframe detected in lossy bitstream.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  if (partition0_length >= data_size) {
    LOG_ERROR("Bad partition length.");
    return WEBP_INFO_BITSTREAM_ERROR;
  }
  GET_BITS(colorspace, 1);
  GET_BITS(clamp_type, 1);
  printf("  Color space:      %d\n", colorspace);
  printf("  Clamp type:       %d\n", clamp_type);
  status = ParseLossySegmentHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  status = ParseLossyFilterHeader(webp_info, data, data_size, bit_pos);
  if (status != WEBP_INFO_OK) return status;
  {  // Partition number and size.
    const uint8_t* part_size = data + partition0_length;
    int num_parts, i;
    size_t part_data_size;
    GET_BITS(num_parts, 2);
    num_parts = 1 << num_parts;
    if ((int)(data_size - partition0_length) < (num_parts - 1) * 3) {
      LOG_ERROR("Truncated lossy bitstream.");
      return WEBP_INFO_TRUNCATED_DATA;
    }
    part_data_size = data_size - partition0_length - (num_parts - 1) * 3;
    printf("  Total partitions: %d\n", num_parts);
    for (i = 1; i < num_parts; ++i) {
      const size_t psize =
          part_size[0] | (part_size[1] << 8) | (part_size[2] << 16);
      if (psize > part_data_size) {
        LOG_ERROR("Truncated partition.");
        return WEBP_INFO_TRUNCATED_DATA;
      }
      printf("  Part. %d length:   %d\n", i, (int)psize);
      part_data_size -= psize;
      part_size += 3;
    }
  }
  // Quantizer.
  {
    int base_q, bit;
    int dq_y1_dc = 0, dq_y2_dc = 0, dq_y2_ac = 0, dq_uv_dc = 0, dq_uv_ac = 0;
    GET_BITS(base_q, 7);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y1_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_y2_ac, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_dc, 4);
    GET_BITS(bit, 1);
    if (bit) GET_SIGNED_BITS(dq_uv_ac, 4);
    printf("  Base Q:           %d\n", base_q);
    printf("  DQ Y1 DC:         %d\n", dq_y1_dc);
    printf("  DQ Y2 DC:         %d\n", dq_y2_dc);
    printf("  DQ Y2 AC:         %d\n", dq_y2_ac);
    printf("  DQ UV DC:         %d\n", dq_uv_dc);
    printf("  DQ UV AC:         %d\n", dq_uv_ac);
  }
  if ((*bit_pos >> 3) >= partition0_length) {
    LOG_ERROR("Truncated lossy bitstream.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  return WEBP_INFO_OK;
}